

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtab.c
# Opt level: O0

void StrTab_Clear(strtab *p)

{
  cc_memheap *pcVar1;
  void *pvVar2;
  size_t sVar3;
  long *local_30;
  stringdef **i;
  strtab *p_local;
  
  if (p == (strtab *)0xfffffffffffffff8) {
    __assert_fail("&(p->Table)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/strtab.c"
                  ,0x20,"void StrTab_Clear(strtab *)");
  }
  local_30 = (long *)(p->Table)._Begin;
  while( true ) {
    if (p == (strtab *)0xfffffffffffffff8) {
      __assert_fail("&(p->Table)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/strtab.c"
                    ,0x20,"void StrTab_Clear(strtab *)");
    }
    if (local_30 == (long *)((p->Table)._Begin + ((p->Table)._Used & 0xfffffffffffffff8))) break;
    pcVar1 = p->Heap;
    pvVar2 = (void *)*local_30;
    sVar3 = tcsbytes((tchar_t *)(*local_30 + 8));
    (*pcVar1->Free)(pcVar1,pvVar2,sVar3 + 8);
    local_30 = local_30 + 1;
  }
  ArrayClear(&p->Table);
  return;
}

Assistant:

static NOINLINE void StrTab_Clear(strtab* p)
{
	stringdef **i;
	for (i=ARRAYBEGIN(p->Table,stringdef*);i!=ARRAYEND(p->Table,stringdef*);++i)
        MemHeap_Free(p->Heap,*i,sizeof(stringdef)+tcsbytes((tchar_t*)(*i+1)));
    ArrayClear(&p->Table);
}